

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

unsigned_long
assembler::anon_unknown_0::_call_external_4<unsigned_long>
          (external_function *f,
          vector<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_> *args,
          registers *regs)

{
  pointer poVar1;
  unsigned_long uVar2;
  
  poVar1 = (args->
           super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<assembler::asmcode::operand,_std::allocator<assembler::asmcode::operand>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)poVar1 == 0x10) {
    uVar2 = (*(code *)(&DAT_0012a404 + *(int *)(&DAT_0012a404 + (ulong)**(uint **)&f->arguments * 4)
                      ))(poVar1,&DAT_0012a404,
                         &DAT_0012a404 +
                         *(int *)(&DAT_0012a404 + (ulong)**(uint **)&f->arguments * 4));
    return uVar2;
  }
  __assert_fail("args.size() == 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/asm/vm.cpp"
                ,0x792,
                "T assembler::(anonymous namespace)::_call_external_4(const external_function &, std::vector<asmcode::operand> &, registers &) [T = unsigned long]"
               );
}

Assistant:

T _call_external_4(const external_function& f, std::vector<asmcode::operand>& args, registers& regs)
  {
      assert(args.size() == 4);
      switch (f.arguments[0])
      {
          case external_function::T_BOOL: return _call_external_4_1<T, bool>(f, args, regs);
          case external_function::T_CHAR_POINTER: return _call_external_4_1<T, char*>(f, args, regs);
          case external_function::T_DOUBLE: return _call_external_4_1<T, double>(f, args, regs);
          case external_function::T_INT64: return _call_external_4_1<T, int64_t>(f, args, regs);
          case external_function::T_VOID: return 0;
      }
  }